

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O0

void __thiscall BamTools::OptionValue::~OptionValue(OptionValue *this)

{
  Variant *in_RDI;
  
  Variant::~Variant(in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

struct UTILS_EXPORT OptionValue
{

    // data members
    bool* pFoundArgument;
    void* pValue;
    std::string ValueTypeDescription;
    bool UseVector;
    bool StoreValue;
    bool IsRequired;
    Variant VariantValue;

    // constructor
    OptionValue()
        : pFoundArgument(NULL)
        , pValue(NULL)
        , UseVector(false)
        , StoreValue(true)
        , IsRequired(false)
    {}
}